

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

time_point __thiscall jaegertracing::Span::startTimeSteady(Span *this)

{
  duration dVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x148))->__data);
  dVar1.__r = *(rep *)(this + 0xf0);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
  return (time_point)(duration)dVar1.__r;
}

Assistant:

SteadyClock::time_point startTimeSteady() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _startTimeSteady;
    }